

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::StripLeftRight(FString *this)

{
  char *pcVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  FStringData *old;
  
  pcVar1 = this->Chars;
  uVar3 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar3 == 0) {
    return;
  }
  uVar5 = 0;
  while ((uVar6 = uVar3, uVar3 != uVar5 &&
         (iVar2 = isspace((uint)(byte)pcVar1[uVar5]), uVar6 = uVar5, iVar2 != 0))) {
    uVar5 = uVar5 + 1;
  }
  sVar7 = uVar3 - uVar6;
  lVar4 = 0;
  do {
    uVar3 = uVar3 - 1;
    if (uVar3 < uVar6) {
LAB_00546ace:
      if (*(int *)(pcVar1 + -4) < 2) {
        for (sVar7 = 0; pcVar1 = this->Chars, sVar7 + uVar6 <= uVar3; sVar7 = sVar7 + 1) {
          pcVar1[sVar7] = pcVar1[uVar6 + sVar7];
        }
        pcVar1[sVar7] = '\0';
        ReallocBuffer(this,sVar7);
        return;
      }
      AllocBuffer(this,sVar7);
      __dest = this->Chars;
      memcpy(__dest,pcVar1,sVar7);
      __dest[sVar7] = '\0';
      FStringData::Release((FStringData *)(pcVar1 + -0xc));
      return;
    }
    iVar2 = isspace((uint)(byte)pcVar1[uVar3]);
    if (iVar2 == 0) {
      if (lVar4 == 0 && uVar6 == 0) {
        return;
      }
      goto LAB_00546ace;
    }
    sVar7 = sVar7 - 1;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}